

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZGeoElSide> * __thiscall
TPZVec<TPZGeoElSide>::operator=(TPZVec<TPZGeoElSide> *this,TPZVec<TPZGeoElSide> *rval)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  TPZGeoElSide *pTVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZGeoElSide *pTVar7;
  TPZVec<TPZGeoElSide> *in_RSI;
  TPZVec<TPZGeoElSide> *in_RDI;
  ulong uVar8;
  int64_t i;
  TPZGeoElSide *in_stack_ffffffffffffff58;
  TPZGeoElSide *in_stack_ffffffffffffff60;
  TPZGeoElSide *local_80;
  long local_28;
  
  if (in_RDI != in_RSI) {
    in_RDI->fNElements = in_RSI->fNElements;
    if ((in_RDI->fStore != (TPZGeoElSide *)0x0) &&
       (pTVar7 = in_RDI->fStore, pTVar7 != (TPZGeoElSide *)0x0)) {
      lVar1 = *(long *)&pTVar7[-1].fSide;
      for (pTVar4 = pTVar7 + lVar1; pTVar7 != pTVar4; pTVar4 = pTVar4 + -1) {
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x10cddb7);
      }
      operator_delete__(&pTVar7[-1].fSide,lVar1 * 0x18 + 8);
    }
    if (in_RSI->fNAlloc == 0) {
      uVar2 = in_RDI->fNElements;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar2;
      uVar5 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar8 = uVar5 + 8;
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar8);
      *puVar6 = uVar2;
      pTVar7 = (TPZGeoElSide *)(puVar6 + 1);
      if (uVar2 != 0) {
        local_80 = pTVar7;
        do {
          TPZGeoElSide::TPZGeoElSide(in_stack_ffffffffffffff60);
          local_80 = local_80 + 1;
        } while (local_80 != pTVar7 + uVar2);
      }
      in_RDI->fStore = pTVar7;
      for (local_28 = 0; local_28 < in_RDI->fNElements; local_28 = local_28 + 1) {
        TPZGeoElSide::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    else {
      in_RDI->fStore = in_RSI->fStore;
    }
    in_RDI->fNAlloc = in_RDI->fNElements;
    in_RSI->fStore = (TPZGeoElSide *)0x0;
    in_RSI->fNElements = 0;
    in_RSI->fNAlloc = 0;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}